

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t parse_keyword(archive_read *a,mtree *mtree,archive_entry *entry,mtree_option *opt,
                     wchar_t *parsed_kws)

{
  aest *paVar1;
  char *_p;
  mtree_option *pmVar2;
  int iVar3;
  wchar_t wVar4;
  int64_t iVar5;
  int64_t iVar6;
  size_t local_a8;
  long local_88;
  long ns;
  int64_t my_time_t_min;
  int64_t my_time_t_max;
  int64_t m;
  dev_t dev_1;
  dev_t dStack_58;
  wchar_t r_1;
  dev_t dev;
  char *pcStack_48;
  wchar_t r;
  char *key;
  char *val;
  wchar_t *parsed_kws_local;
  mtree_option *opt_local;
  archive_entry *entry_local;
  mtree *mtree_local;
  archive_read *a_local;
  
  pcStack_48 = opt->value;
  if (*pcStack_48 == '\0') {
    a_local._4_4_ = L'\0';
  }
  else {
    val = (char *)parsed_kws;
    parsed_kws_local = (wchar_t *)opt;
    opt_local = (mtree_option *)entry;
    entry_local = (archive_entry *)mtree;
    mtree_local = (mtree *)a;
    iVar3 = strcmp(pcStack_48,"nochange");
    if (iVar3 == 0) {
      *(uint *)val = *(uint *)val | 0x1000;
      a_local._4_4_ = L'\0';
    }
    else {
      iVar3 = strcmp(pcStack_48,"optional");
      if (iVar3 == 0) {
        *(uint *)val = *(uint *)val | 0x800;
        a_local._4_4_ = L'\0';
      }
      else {
        iVar3 = strcmp(pcStack_48,"ignore");
        if (iVar3 == 0) {
          a_local._4_4_ = L'\0';
        }
        else {
          key = strchr(pcStack_48,0x3d);
          if (key == (char *)0x0) {
            archive_set_error((archive *)mtree_local,0x54,"Malformed attribute \"%s\" (%d)",
                              pcStack_48,(ulong)(uint)(int)*pcStack_48);
            a_local._4_4_ = L'\xffffffec';
          }
          else {
            *key = '\0';
            key = key + 1;
            switch(*pcStack_48) {
            case 'c':
              iVar3 = strcmp(pcStack_48,"content");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_48,"contents"), iVar3 == 0)) {
                parse_escapes(key,(mtree_entry *)0x0);
                _p = key;
                *(undefined8 *)&(entry_local->ae_stat).aest_dev_is_broken_down = 0;
                paVar1 = &entry_local->ae_stat;
                if (key == (char *)0x0) {
                  local_a8 = 0;
                }
                else {
                  local_a8 = strlen(key);
                }
                archive_strncat((archive_string *)&paVar1->aest_uid,_p,local_a8);
                return L'\0';
              }
              iVar3 = strcmp(pcStack_48,"cksum");
              if (iVar3 == 0) {
                return L'\0';
              }
              break;
            case 'd':
              iVar3 = strcmp(pcStack_48,"device");
              if (iVar3 == 0) {
                *(uint *)val = *(uint *)val | 1;
                dev._4_4_ = parse_device(&stack0xffffffffffffffa8,(archive *)mtree_local,key);
                if (dev._4_4_ == L'\0') {
                  archive_entry_set_rdev((archive_entry *)opt_local,dStack_58);
                }
                return dev._4_4_;
              }
              break;
            default:
              break;
            case 'f':
              iVar3 = strcmp(pcStack_48,"flags");
              if (iVar3 == 0) {
                *(uint *)val = *(uint *)val | 2;
                archive_entry_copy_fflags_text((archive_entry *)opt_local,key);
                return L'\0';
              }
              break;
            case 'g':
              iVar3 = strcmp(pcStack_48,"gid");
              pmVar2 = opt_local;
              if (iVar3 == 0) {
                *(uint *)val = *(uint *)val | 4;
                iVar6 = mtree_atol(&key,L'\n');
                archive_entry_set_gid((archive_entry *)pmVar2,iVar6);
                return L'\0';
              }
              iVar3 = strcmp(pcStack_48,"gname");
              if (iVar3 == 0) {
                *(uint *)val = *(uint *)val | 8;
                archive_entry_copy_gname((archive_entry *)opt_local,key);
                return L'\0';
              }
              break;
            case 'i':
              iVar3 = strcmp(pcStack_48,"inode");
              pmVar2 = opt_local;
              if (iVar3 == 0) {
                iVar6 = mtree_atol(&key,L'\n');
                archive_entry_set_ino((archive_entry *)pmVar2,iVar6);
                return L'\0';
              }
              break;
            case 'l':
              iVar3 = strcmp(pcStack_48,"link");
              if (iVar3 == 0) {
                parse_escapes(key,(mtree_entry *)0x0);
                archive_entry_copy_symlink((archive_entry *)opt_local,key);
                return L'\0';
              }
              break;
            case 'm':
              iVar3 = strcmp(pcStack_48,"md5");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_48,"md5digest"), iVar3 == 0)) {
                wVar4 = parse_digest((archive_read *)mtree_local,(archive_entry *)opt_local,key,
                                     L'\x01');
                return wVar4;
              }
              iVar3 = strcmp(pcStack_48,"mode");
              pmVar2 = opt_local;
              if (iVar3 == 0) {
                if (('/' < *key) && (*key < '8')) {
                  *(uint *)val = *(uint *)val | 0x40;
                  iVar6 = mtree_atol(&key,L'\b');
                  archive_entry_set_perm((archive_entry *)pmVar2,(mode_t)iVar6);
                  return L'\0';
                }
                archive_set_error((archive *)mtree_local,0x54,
                                  "Symbolic or non-octal mode \"%s\" unsupported",key);
                return L'\xffffffec';
              }
              break;
            case 'n':
              iVar3 = strcmp(pcStack_48,"nlink");
              pmVar2 = opt_local;
              if (iVar3 == 0) {
                *(uint *)val = *(uint *)val | 0x20;
                iVar6 = mtree_atol(&key,L'\n');
                archive_entry_set_nlink((archive_entry *)pmVar2,(uint)iVar6);
                return L'\0';
              }
              break;
            case 'r':
              iVar3 = strcmp(pcStack_48,"resdevice");
              if (iVar3 == 0) {
                dev_1._4_4_ = parse_device((dev_t *)&m,(archive *)mtree_local,key);
                if (dev_1._4_4_ == L'\0') {
                  archive_entry_set_dev((archive_entry *)opt_local,m);
                }
                return dev_1._4_4_;
              }
              iVar3 = strcmp(pcStack_48,"rmd160");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_48,"rmd160digest"), iVar3 == 0)) {
                wVar4 = parse_digest((archive_read *)mtree_local,(archive_entry *)opt_local,key,
                                     L'\x02');
                return wVar4;
              }
              break;
            case 's':
              iVar3 = strcmp(pcStack_48,"sha1");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_48,"sha1digest"), iVar3 == 0)) {
                wVar4 = parse_digest((archive_read *)mtree_local,(archive_entry *)opt_local,key,
                                     L'\x03');
                return wVar4;
              }
              iVar3 = strcmp(pcStack_48,"sha256");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_48,"sha256digest"), iVar3 == 0)) {
                wVar4 = parse_digest((archive_read *)mtree_local,(archive_entry *)opt_local,key,
                                     L'\x04');
                return wVar4;
              }
              iVar3 = strcmp(pcStack_48,"sha384");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_48,"sha384digest"), iVar3 == 0)) {
                wVar4 = parse_digest((archive_read *)mtree_local,(archive_entry *)opt_local,key,
                                     L'\x05');
                return wVar4;
              }
              iVar3 = strcmp(pcStack_48,"sha512");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcStack_48,"sha512digest"), iVar3 == 0)) {
                wVar4 = parse_digest((archive_read *)mtree_local,(archive_entry *)opt_local,key,
                                     L'\x06');
                return wVar4;
              }
              iVar3 = strcmp(pcStack_48,"size");
              pmVar2 = opt_local;
              if (iVar3 == 0) {
                iVar6 = mtree_atol(&key,L'\n');
                archive_entry_set_size((archive_entry *)pmVar2,iVar6);
                return L'\0';
              }
              break;
            case 't':
              iVar3 = strcmp(pcStack_48,"tags");
              if (iVar3 == 0) {
                return L'\0';
              }
              iVar3 = strcmp(pcStack_48,"time");
              if (iVar3 == 0) {
                my_time_t_max = get_time_t_max();
                iVar6 = get_time_t_min();
                local_88 = 0;
                *(uint *)val = *(uint *)val | 0x10;
                iVar5 = mtree_atol(&key,L'\n');
                if (*key == '.') {
                  key = key + 1;
                  local_88 = mtree_atol(&key,L'\n');
                  if (local_88 < 0) {
                    local_88 = 0;
                  }
                  else if (999999999 < local_88) {
                    local_88 = 999999999;
                  }
                }
                if ((iVar5 <= my_time_t_max) && (my_time_t_max = iVar5, iVar5 < iVar6)) {
                  my_time_t_max = iVar6;
                }
                archive_entry_set_mtime((archive_entry *)opt_local,my_time_t_max,local_88);
                return L'\0';
              }
              iVar3 = strcmp(pcStack_48,"type");
              if (iVar3 == 0) {
                switch(*key) {
                case 'b':
                  iVar3 = strcmp(key,"block");
                  if (iVar3 == 0) {
                    *(uint *)val = *(uint *)val | 0x100;
                    archive_entry_set_filetype((archive_entry *)opt_local,0x6000);
                    return L'\0';
                  }
                  break;
                case 'c':
                  iVar3 = strcmp(key,"char");
                  if (iVar3 == 0) {
                    *(uint *)val = *(uint *)val | 0x100;
                    archive_entry_set_filetype((archive_entry *)opt_local,0x2000);
                    return L'\0';
                  }
                  break;
                case 'd':
                  iVar3 = strcmp(key,"dir");
                  if (iVar3 == 0) {
                    *(uint *)val = *(uint *)val | 0x100;
                    archive_entry_set_filetype((archive_entry *)opt_local,0x4000);
                    return L'\0';
                  }
                  break;
                default:
                  break;
                case 'f':
                  iVar3 = strcmp(key,"fifo");
                  if (iVar3 == 0) {
                    *(uint *)val = *(uint *)val | 0x100;
                    archive_entry_set_filetype((archive_entry *)opt_local,0x1000);
                    return L'\0';
                  }
                  iVar3 = strcmp(key,"file");
                  if (iVar3 == 0) {
                    *(uint *)val = *(uint *)val | 0x100;
                    archive_entry_set_filetype((archive_entry *)opt_local,0x8000);
                    return L'\0';
                  }
                  break;
                case 'l':
                  iVar3 = strcmp(key,"link");
                  if (iVar3 == 0) {
                    *(uint *)val = *(uint *)val | 0x100;
                    archive_entry_set_filetype((archive_entry *)opt_local,0xa000);
                    return L'\0';
                  }
                }
                archive_set_error((archive *)mtree_local,0x54,
                                  "Unrecognized file type \"%s\"; assuming \"file\"",key);
                archive_entry_set_filetype((archive_entry *)opt_local,0x8000);
                return L'\xffffffec';
              }
              break;
            case 'u':
              iVar3 = strcmp(pcStack_48,"uid");
              pmVar2 = opt_local;
              if (iVar3 == 0) {
                *(uint *)val = *(uint *)val | 0x200;
                iVar6 = mtree_atol(&key,L'\n');
                archive_entry_set_uid((archive_entry *)pmVar2,iVar6);
                return L'\0';
              }
              iVar3 = strcmp(pcStack_48,"uname");
              if (iVar3 == 0) {
                *(uint *)val = *(uint *)val | 0x400;
                archive_entry_copy_uname((archive_entry *)opt_local,key);
                return L'\0';
              }
            }
            archive_set_error((archive *)mtree_local,0x54,"Unrecognized key %s=%s",pcStack_48,key);
            a_local._4_4_ = L'\xffffffec';
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
parse_keyword(struct archive_read *a, struct mtree *mtree,
    struct archive_entry *entry, struct mtree_option *opt, int *parsed_kws)
{
	char *val, *key;

	key = opt->value;

	if (*key == '\0')
		return (ARCHIVE_OK);

	if (strcmp(key, "nochange") == 0) {
		*parsed_kws |= MTREE_HAS_NOCHANGE;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "optional") == 0) {
		*parsed_kws |= MTREE_HAS_OPTIONAL;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "ignore") == 0) {
		/*
		 * The mtree processing is not recursive, so
		 * recursion will only happen for explicitly listed
		 * entries.
		 */
		return (ARCHIVE_OK);
	}

	val = strchr(key, '=');
	if (val == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Malformed attribute \"%s\" (%d)", key, key[0]);
		return (ARCHIVE_WARN);
	}

	*val = '\0';
	++val;

	switch (key[0]) {
	case 'c':
		if (strcmp(key, "content") == 0
		    || strcmp(key, "contents") == 0) {
			parse_escapes(val, NULL);
			archive_strcpy(&mtree->contents_name, val);
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "cksum") == 0)
			return (ARCHIVE_OK);
		break;
	case 'd':
		if (strcmp(key, "device") == 0) {
			/* stat(2) st_rdev field, e.g. the major/minor IDs
			 * of a char/block special file */
			int r;
			dev_t dev;

			*parsed_kws |= MTREE_HAS_DEVICE;
			r = parse_device(&dev, &a->archive, val);
			if (r == ARCHIVE_OK)
				archive_entry_set_rdev(entry, dev);
			return r;
		}
		break;
	case 'f':
		if (strcmp(key, "flags") == 0) {
			*parsed_kws |= MTREE_HAS_FFLAGS;
			archive_entry_copy_fflags_text(entry, val);
			return (ARCHIVE_OK);
		}
		break;
	case 'g':
		if (strcmp(key, "gid") == 0) {
			*parsed_kws |= MTREE_HAS_GID;
			archive_entry_set_gid(entry, mtree_atol(&val, 10));
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "gname") == 0) {
			*parsed_kws |= MTREE_HAS_GNAME;
			archive_entry_copy_gname(entry, val);
			return (ARCHIVE_OK);
		}
		break;
	case 'i':
		if (strcmp(key, "inode") == 0) {
			archive_entry_set_ino(entry, mtree_atol(&val, 10));
			return (ARCHIVE_OK);
		}
		break;
	case 'l':
		if (strcmp(key, "link") == 0) {
			parse_escapes(val, NULL);
			archive_entry_copy_symlink(entry, val);
			return (ARCHIVE_OK);
		}
		break;
	case 'm':
		if (strcmp(key, "md5") == 0 || strcmp(key, "md5digest") == 0) {
			return parse_digest(a, entry, val,
			    ARCHIVE_ENTRY_DIGEST_MD5);
		}
		if (strcmp(key, "mode") == 0) {
			if (val[0] < '0' || val[0] > '7') {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Symbolic or non-octal mode \"%s\" unsupported", val);
				return (ARCHIVE_WARN);
			}
			*parsed_kws |= MTREE_HAS_PERM;
			archive_entry_set_perm(entry, (mode_t)mtree_atol(&val, 8));
			return (ARCHIVE_OK);
		}
		break;
	case 'n':
		if (strcmp(key, "nlink") == 0) {
			*parsed_kws |= MTREE_HAS_NLINK;
			archive_entry_set_nlink(entry,
				(unsigned int)mtree_atol(&val, 10));
			return (ARCHIVE_OK);
		}
		break;
	case 'r':
		if (strcmp(key, "resdevice") == 0) {
			/* stat(2) st_dev field, e.g. the device ID where the
			 * inode resides */
			int r;
			dev_t dev;

			r = parse_device(&dev, &a->archive, val);
			if (r == ARCHIVE_OK)
				archive_entry_set_dev(entry, dev);
			return r;
		}
		if (strcmp(key, "rmd160") == 0 ||
		    strcmp(key, "rmd160digest") == 0) {
			return parse_digest(a, entry, val,
			    ARCHIVE_ENTRY_DIGEST_RMD160);
		}
		break;
	case 's':
		if (strcmp(key, "sha1") == 0 ||
		    strcmp(key, "sha1digest") == 0) {
			return parse_digest(a, entry, val,
			    ARCHIVE_ENTRY_DIGEST_SHA1);
		}
		if (strcmp(key, "sha256") == 0 ||
		    strcmp(key, "sha256digest") == 0) {
			return parse_digest(a, entry, val,
			    ARCHIVE_ENTRY_DIGEST_SHA256);
		}
		if (strcmp(key, "sha384") == 0 ||
		    strcmp(key, "sha384digest") == 0) {
			return parse_digest(a, entry, val,
			    ARCHIVE_ENTRY_DIGEST_SHA384);
		}
		if (strcmp(key, "sha512") == 0 ||
		    strcmp(key, "sha512digest") == 0) {
			return parse_digest(a, entry, val,
			    ARCHIVE_ENTRY_DIGEST_SHA512);
		}
		if (strcmp(key, "size") == 0) {
			archive_entry_set_size(entry, mtree_atol(&val, 10));
			return (ARCHIVE_OK);
		}
		break;
	case 't':
		if (strcmp(key, "tags") == 0) {
			/*
			 * Comma delimited list of tags.
			 * Ignore the tags for now, but the interface
			 * should be extended to allow inclusion/exclusion.
			 */
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "time") == 0) {
			int64_t m;
			int64_t my_time_t_max = get_time_t_max();
			int64_t my_time_t_min = get_time_t_min();
			long ns = 0;

			*parsed_kws |= MTREE_HAS_MTIME;
			m = mtree_atol(&val, 10);
			/* Replicate an old mtree bug:
			 * 123456789.1 represents 123456789
			 * seconds and 1 nanosecond. */
			if (*val == '.') {
				++val;
				ns = (long)mtree_atol(&val, 10);
				if (ns < 0)
					ns = 0;
				else if (ns > 999999999)
					ns = 999999999;
			}
			if (m > my_time_t_max)
				m = my_time_t_max;
			else if (m < my_time_t_min)
				m = my_time_t_min;
			archive_entry_set_mtime(entry, (time_t)m, ns);
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "type") == 0) {
			switch (val[0]) {
			case 'b':
				if (strcmp(val, "block") == 0) {
					*parsed_kws |= MTREE_HAS_TYPE;
					archive_entry_set_filetype(entry,
						AE_IFBLK);
					return (ARCHIVE_OK);
				}
				break;
			case 'c':
				if (strcmp(val, "char") == 0) {
					*parsed_kws |= MTREE_HAS_TYPE;
					archive_entry_set_filetype(entry,
						AE_IFCHR);
					return (ARCHIVE_OK);
				}
				break;
			case 'd':
				if (strcmp(val, "dir") == 0) {
					*parsed_kws |= MTREE_HAS_TYPE;
					archive_entry_set_filetype(entry,
						AE_IFDIR);
					return (ARCHIVE_OK);
				}
				break;
			case 'f':
				if (strcmp(val, "fifo") == 0) {
					*parsed_kws |= MTREE_HAS_TYPE;
					archive_entry_set_filetype(entry,
						AE_IFIFO);
					return (ARCHIVE_OK);
				}
				if (strcmp(val, "file") == 0) {
					*parsed_kws |= MTREE_HAS_TYPE;
					archive_entry_set_filetype(entry,
						AE_IFREG);
					return (ARCHIVE_OK);
				}
				break;
			case 'l':
				if (strcmp(val, "link") == 0) {
					*parsed_kws |= MTREE_HAS_TYPE;
					archive_entry_set_filetype(entry,
						AE_IFLNK);
					return (ARCHIVE_OK);
				}
				break;
			default:
				break;
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unrecognized file type \"%s\"; "
			    "assuming \"file\"", val);
			archive_entry_set_filetype(entry, AE_IFREG);
			return (ARCHIVE_WARN);
		}
		break;
	case 'u':
		if (strcmp(key, "uid") == 0) {
			*parsed_kws |= MTREE_HAS_UID;
			archive_entry_set_uid(entry, mtree_atol(&val, 10));
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "uname") == 0) {
			*parsed_kws |= MTREE_HAS_UNAME;
			archive_entry_copy_uname(entry, val);
			return (ARCHIVE_OK);
		}
		break;
	default:
		break;
	}
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Unrecognized key %s=%s", key, val);
	return (ARCHIVE_WARN);
}